

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_FilePathUtils.cpp
# Opt level: O0

String * axl::io::getTempDir(void)

{
  bool bVar1;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_RDI;
  String tmpDir;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  StringBase<char,_axl::sl::StringDetailsBase<char>_> *in_stack_ffffffffffffffd0;
  StringRefBase<char,_axl::sl::StringDetailsBase<char>_> local_28;
  
  getenv("TMPDIR");
  this = &local_28;
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
            (in_stack_ffffffffffffffd0,
             (C *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),(size_t)this);
  bVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::isEmpty(this);
  if (bVar1) {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              (in_stack_ffffffffffffffd0,
               (C *)CONCAT44(in_stack_ffffffffffffffcc,
                             CONCAT13(bVar1,(int3)in_stack_ffffffffffffffc8)),(size_t)this);
  }
  else {
    sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::StringBase
              ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)this,in_RDI);
  }
  sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::~StringBase
            ((StringBase<char,_axl::sl::StringDetailsBase<char>_> *)0x16d33e);
  return in_RDI;
}

Assistant:

sl::String
getTempDir() {
#if (_AXL_OS_WIN)
	return getTempDir_w();
#else
	sl::String tmpDir = ::getenv("TMPDIR");
	return !tmpDir.isEmpty() ? tmpDir : "/tmp";
#endif
}